

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar2_LibEval(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth,int fKeepLevel,Vec_Int_t *vLeavesBest2
                )

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int nCapMin;
  long lVar5;
  long lVar6;
  Dar_LibObj_t *pObj;
  long lVar7;
  int local_50;
  int local_4c;
  
  if (vCutLits->nSize != 4) {
    __assert_fail("Vec_IntSize(vCutLits) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                  ,0x4ab,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  if (0xffff < uTruth) {
    __assert_fail("(uTruth >> 16) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                  ,0x4ac,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  Dar2_LibCutMatch(p,vCutLits,uTruth);
  bVar1 = s_DarLib->pMap[uTruth];
  Dar2_LibEvalAssignNums(p,(uint)bVar1);
  iVar4 = -1;
  local_4c = 1000000;
  local_50 = -1000000;
  lVar5 = 0;
  do {
    if (s_DarLib->nSubgr0[bVar1] <= lVar5) {
      if (iVar4 == -1) {
        __assert_fail("p_OutBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                      ,0x4d9,
                      "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
      }
      return iVar4;
    }
    pObj = s_DarLib->pObjs + s_DarLib->pSubgr0[bVar1][lVar5];
    iVar2 = Dar2_LibEval_rec(pObj,(int)lVar5);
    iVar3 = -iVar2;
    if (fKeepLevel == 0) {
      if ((local_50 == iVar3 || SBORROW4(local_50,iVar3) != local_50 + iVar2 < 0) &&
         ((local_50 != iVar3 || (s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level < local_4c))))
      goto LAB_004031c4;
    }
    else {
      iVar2 = s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level;
      if ((iVar2 <= local_4c) && ((iVar2 != local_4c || (local_50 < iVar3)))) {
LAB_004031c4:
        vLeavesBest2->nSize = 0;
        lVar7 = 0;
        for (lVar6 = 0; lVar6 < vCutLits->nSize; lVar6 = lVar6 + 1) {
          iVar4 = *(int *)(s_DarLib->pDatas->nLats + lVar7 + -0x15);
          iVar2 = vLeavesBest2->nSize;
          if (iVar2 == vLeavesBest2->nCap) {
            nCapMin = iVar2 * 2;
            if (iVar2 < 0x10) {
              nCapMin = 0x10;
            }
            Vec_IntGrow(vLeavesBest2,nCapMin);
            iVar2 = vLeavesBest2->nSize;
          }
          vLeavesBest2->nSize = iVar2 + 1;
          vLeavesBest2->pArray[iVar2] = iVar4;
          lVar7 = lVar7 + 0x18;
        }
        iVar4 = s_DarLib->pSubgr0[bVar1][lVar5];
        local_4c = s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level;
        local_50 = iVar3;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int Dar2_LibEval( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth, int fKeepLevel, Vec_Int_t * vLeavesBest2 )
{
    int p_OutBest    = -1;
    int p_OutNumBest = -1;
    int p_LevelBest  =  1000000;
    int p_GainBest   = -1000000;
    int p_ClassBest  = -1;
//    int fTraining    =  0;
    Dar_LibObj_t * pObj;
    int Out, k, Class, nNodesSaved, nNodesAdded, nNodesGained;
//    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vCutLits) == 4 );
    assert( (uTruth >> 16) == 0 );
    // check if the cut exits and assigns leaves and their levels
    if ( !Dar2_LibCutMatch(p, vCutLits, uTruth) )
        return -1;
    // mark MFFC of the node
//    nNodesSaved = Dar2_LibCutMarkMffc( p->pAig, pRoot, pCut->nLeaves, p->pPars->fPower? &PowerSaved : NULL );
    nNodesSaved = 0;
    // evaluate the cut
    Class = s_DarLib->pMap[uTruth];
    Dar2_LibEvalAssignNums( p, Class );
    // profile outputs by their savings
//    p->nTotalSubgs += s_DarLib->nSubgr0[Class];
//    p->ClassSubgs[Class] += s_DarLib->nSubgr0[Class];
    for ( Out = 0; Out < s_DarLib->nSubgr0[Class]; Out++ )
    {
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pSubgr0[Class][Out]);
//        nNodesAdded = Dar2_LibEval_rec( pObj, Out, nNodesSaved - !p->pPars->fUseZeros, Required, p->pPars->fPower? &PowerAdded : NULL );
        nNodesAdded = Dar2_LibEval_rec( pObj, Out );
        nNodesGained = nNodesSaved - nNodesAdded;
        if ( fKeepLevel )
        {
            if ( s_DarLib->pDatas[pObj->Num].Level >  p_LevelBest || 
                (s_DarLib->pDatas[pObj->Num].Level == p_LevelBest && nNodesGained <= p_GainBest) )
                continue;
        }
        else
        {
            if ( nNodesGained <  p_GainBest || 
                (nNodesGained == p_GainBest && s_DarLib->pDatas[pObj->Num].Level >= p_LevelBest) )
                continue;
        }
        // remember this possibility
        Vec_IntClear( vLeavesBest2 );
        for ( k = 0; k < Vec_IntSize(vCutLits); k++ )
            Vec_IntPush( vLeavesBest2, s_DarLib->pDatas[k].iGunc );
        p_OutBest    = s_DarLib->pSubgr0[Class][Out];
        p_OutNumBest = Out;
        p_LevelBest  = s_DarLib->pDatas[pObj->Num].Level;
        p_GainBest   = nNodesGained;
        p_ClassBest  = Class;
//        assert( p_LevelBest <= Required );
    }
//clk = Abc_Clock() - clk;
//p->ClassTimes[Class] += clk;
//p->timeEval += clk;
    assert( p_OutBest != -1 );
    return p_OutBest;
}